

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typeop.cc
# Opt level: O3

void __thiscall TypeOpFloatAbs::TypeOpFloatAbs(TypeOpFloatAbs *this,TypeFactory *t,Translate *trans)

{
  OpBehavior *pOVar1;
  string local_40;
  
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"ABS","");
  TypeOp::TypeOp((TypeOp *)this,t,CPUI_FLOAT_ABS,&local_40);
  (this->super_TypeOpFunc).super_TypeOp._vptr_TypeOp = (_func_int **)&PTR_setMetatypeIn_003c0cc0;
  (this->super_TypeOpFunc).metaout = TYPE_FLOAT;
  (this->super_TypeOpFunc).metain = TYPE_FLOAT;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  (this->super_TypeOpFunc).super_TypeOp._vptr_TypeOp = (_func_int **)&PTR_setMetatypeIn_003c17e8;
  (this->super_TypeOpFunc).super_TypeOp.opflags = 0x48000;
  pOVar1 = (OpBehavior *)operator_new(0x18);
  pOVar1->opcode = CPUI_FLOAT_ABS;
  pOVar1->isunary = true;
  pOVar1->isspecial = false;
  pOVar1->_vptr_OpBehavior = (_func_int **)&PTR__OpBehavior_003cc088;
  pOVar1[1]._vptr_OpBehavior = (_func_int **)trans;
  (this->super_TypeOpFunc).super_TypeOp.behave = pOVar1;
  return;
}

Assistant:

TypeOpFloatAbs::TypeOpFloatAbs(TypeFactory *t,const Translate *trans)
  : TypeOpFunc(t,CPUI_FLOAT_ABS,"ABS",TYPE_FLOAT,TYPE_FLOAT)
{
  opflags = PcodeOp::unary | PcodeOp::floatingpoint;
  behave = new OpBehaviorFloatAbs(trans);
}